

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O1

BSSRDFProbeSegment * __thiscall
pbrt::TabulatedBSSRDF::Sample
          (BSSRDFProbeSegment *__return_storage_ptr__,TabulatedBSSRDF *this,Float u1,Point2f *u2)

{
  float fVar1;
  float fVar2;
  Float FVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined8 uVar5;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float local_b8 [4];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  
  local_b8[0] = 0.5;
  local_b8[1] = 0.25;
  local_b8[2] = 0.25;
  fVar17 = 0.0;
  lVar10 = 0;
  do {
    fVar17 = fVar17 + *(float *)((long)local_b8 + lVar10);
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xc);
  local_98 = CONCAT44(local_98._4_4_,fVar17);
  uVar11 = 0;
  do {
    if (u1 < local_b8[uVar11] / fVar17) goto LAB_00433f8d;
    u1 = u1 - local_b8[uVar11] / fVar17;
    uVar11 = uVar11 + 1;
  } while (uVar11 != 3);
  uVar11 = 3;
LAB_00433f8d:
  local_a8._0_4_ = u1;
  if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
     (iVar9 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg)
     , iVar9 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
               SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
               {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x760) = *(long *)(in_FS_OFFSET + -0x760) + 1;
  if (uVar11 == 3) {
    *(long *)(in_FS_OFFSET + -0x768) = *(long *)(in_FS_OFFSET + -0x768) + 1;
    uVar11 = 2;
  }
  if ((uint)uVar11 < 3) {
    auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                         ZEXT416((uint)((float)local_a8._0_4_ /
                                       (local_b8[(int)(uint)uVar11] / (float)local_98))));
    uVar11 = uVar11 & 0xffffffff;
    fVar17 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                               super_Tuple3<pbrt::Point3,_float>.x + (&DAT_005e6e50)[uVar11]);
    local_a8 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                        super_Tuple3<pbrt::Point3,_float>.x +
                                (&DAT_005e6e38)[uVar11]));
    local_48 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                        super_Tuple3<pbrt::Point3,_float>.x +
                                *(long *)(&DAT_005e6e20 + uVar11 * 8)));
    fVar1 = *(float *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                              super_Tuple3<pbrt::Point3,_float>.x +
                      *(long *)(&DAT_005e6e98 + uVar11 * 8));
    local_38 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                        super_Tuple3<pbrt::Point3,_float>.x +
                                (&DAT_005e6e80)[uVar11]));
    local_58 = ZEXT416(*(uint *)((long)&(((TabulatedBSSRDF *)(&this->sigma_t + -5))->po).
                                        super_Tuple3<pbrt::Point3,_float>.x +
                                (&DAT_005e6e68)[uVar11]));
    fVar2 = (this->sigma_t).values.values[uVar11 * 3 + -0xb];
    local_98 = *(undefined8 *)((this->sigma_t).values.values + uVar11 * 3 + -0xd);
    uStack_90 = 0;
    iVar8 = (int)(auVar19._0_4_ * 4.0);
    iVar9 = 3;
    if (iVar8 < 3) {
      iVar9 = iVar8;
    }
    local_88 = Sample_Sr(this,iVar9,(u2->super_Tuple2<pbrt::Point2,_float>).x);
    if (0.0 <= local_88) {
      fVar14 = (u2->super_Tuple2<pbrt::Point2,_float>).y;
      auVar16._0_4_ = Sample_Sr(this,iVar9,0.999);
      auVar16._4_60_ = extraout_var;
      if (local_88 < auVar16._0_4_) {
        fVar14 = fVar14 * 6.2831855;
        auVar19 = vfmsub213ss_fma(auVar16._0_16_,auVar16._0_16_,ZEXT416((uint)(local_88 * local_88))
                                 );
        if (auVar19._0_4_ < 0.0) {
          fVar13 = sqrtf(auVar19._0_4_);
        }
        else {
          auVar19 = vsqrtss_avx(auVar19,auVar19);
          fVar13 = auVar19._0_4_;
        }
        local_68 = ZEXT416((uint)(fVar13 + fVar13));
        local_78 = cosf(fVar14);
        fVar17 = local_78 * fVar17;
        fVar14 = sinf(fVar14);
        fVar2 = (float)local_68._0_4_ * fVar2;
        fVar17 = local_88 * (fVar14 * fVar1 + fVar17) +
                 (this->po).super_Tuple3<pbrt::Point3,_float>.z + fVar2 * -0.5;
        auVar19 = vinsertps_avx(local_48,ZEXT416((uint)local_a8._0_4_),0x10);
        auVar7 = vinsertps_avx(local_58,ZEXT416((uint)local_38._0_4_),0x10);
        uVar4 = (this->po).super_Tuple3<pbrt::Point3,_float>.x;
        uVar6 = (this->po).super_Tuple3<pbrt::Point3,_float>.y;
        auVar18._0_4_ = (float)local_68._0_4_ * (float)local_98;
        auVar18._4_4_ = (float)local_68._0_4_ * local_98._4_4_;
        auVar18._8_4_ = (float)local_68._0_4_ * (float)uStack_90;
        auVar18._12_4_ = (float)local_68._0_4_ * uStack_90._4_4_;
        auVar12._8_4_ = 0xbf000000;
        auVar12._0_8_ = 0xbf000000bf000000;
        auVar12._12_4_ = 0xbf000000;
        auVar12 = vmulps_avx512vl(auVar18,auVar12);
        auVar15._0_4_ =
             (float)uVar4 + local_88 * (auVar19._0_4_ * local_78 + auVar7._0_4_ * fVar14) +
             auVar12._0_4_;
        auVar15._4_4_ =
             (float)uVar6 + local_88 * (auVar19._4_4_ * local_78 + auVar7._4_4_ * fVar14) +
             auVar12._4_4_;
        auVar15._8_4_ =
             local_88 * (auVar19._8_4_ * local_78 + auVar7._8_4_ * fVar14) + 0.0 + auVar12._8_4_;
        auVar15._12_4_ =
             local_88 * (auVar19._12_4_ * local_78 + auVar7._12_4_ * fVar14) + 0.0 + auVar12._12_4_;
        auVar19._0_4_ = auVar18._0_4_ + auVar15._0_4_;
        auVar19._4_4_ = auVar18._4_4_ + auVar15._4_4_;
        auVar19._8_4_ = auVar18._8_4_ + auVar15._8_4_;
        auVar19._12_4_ = auVar18._12_4_ + auVar15._12_4_;
        FVar3 = this->time;
        uVar5 = vmovlps_avx(auVar15);
        (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
        (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)uVar5 >> 0x20);
        (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.z = fVar17;
        uVar5 = vmovlps_avx(auVar19);
        (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar5;
        (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)uVar5 >> 0x20);
        (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.z = fVar2 + fVar17;
        __return_storage_ptr__->time = FVar3;
        __return_storage_ptr__->valid = true;
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    (__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->p0).super_Tuple3<pbrt::Point3,_float>.z = 0;
    (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    (__return_storage_ptr__->p1).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    __return_storage_ptr__->time = 0.0;
    __return_storage_ptr__->valid = false;
    *(undefined3 *)&__return_storage_ptr__->field_0x1d = 0;
    return __return_storage_ptr__;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bssrdf.h"
           ,0xd2,"Unexpected value returned from SampleDiscrete");
}

Assistant:

PBRT_CPU_GPU
    BSSRDFProbeSegment Sample(Float u1, const Point2f &u2) const {
        // Choose projection axis for BSSRDF sampling
        Vector3f vx, vy, vz;
        switch (SampleDiscrete({0.5, .25, .25}, u1, nullptr, &u1)) {
        case 0:
            vx = ss;
            vy = ts;
            vz = Vector3f(ns);
            break;
        case 1:
            // Prepare for sampling rays with respect to _ss_
            vx = ts;
            vy = Vector3f(ns);
            vz = ss;
            break;

        case 2:
            // Prepare for sampling rays with respect to _ts_
            vx = Vector3f(ns);
            vy = ss;
            vz = ts;
            break;

        default:
            LOG_FATAL("Unexpected value returned from SampleDiscrete");
        }

        // Choose spectral channel for BSSRDF sampling
        int ch = std::min<int>(u1 * NSpectrumSamples, NSpectrumSamples - 1);
        u1 = std::min(u1 * NSpectrumSamples - ch, OneMinusEpsilon);

        // Sample BSSRDF profile in polar coordinates
        Float r = Sample_Sr(ch, u2[0]);
        if (r < 0)
            return {};
        Float phi = 2 * Pi * u2[1];

        // Compute BSSRDF profile bounds and intersection height
        Float rMax = Sample_Sr(ch, 0.999f);
        if (r >= rMax)
            return {};
        Float l = 2 * std::sqrt(rMax * rMax - r * r);

        // Return BSSRDF sampling ray segment
        Point3f pStart =
            po + r * (vx * std::cos(phi) + vy * std::sin(phi)) - l * vz * 0.5f;
        Point3f pTarget = pStart + l * vz;
        return BSSRDFProbeSegment{pStart, pTarget, time};
    }